

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::DoAddVar(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,double lb,double ub,Type type)

{
  int iVar1;
  uint uVar2;
  Var VVar3;
  ValueNode *pVVar4;
  uint uVar5;
  int iVar6;
  NodeRange NVar7;
  
  VVar3 = FlatModel<mp::DefaultFlatModelParams>::AddVar__basic
                    (&this->super_FlatModel<mp::DefaultFlatModelParams>,lb,ub,type);
  pVVar4 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                     (&(this->value_presolver_).super_ValuePresolverImpl.dest_.vars_);
  uVar2 = (uint)pVVar4->sz_;
  uVar5 = VVar3 >> 0x1f & uVar2;
  iVar1 = uVar5 + VVar3;
  iVar6 = uVar5 + VVar3 + 1;
  if ((int)uVar2 <= iVar1) {
    pVVar4->sz_ = (long)iVar6;
  }
  NVar7.ir_.end_ = iVar6;
  NVar7.ir_.beg_ = iVar1;
  NVar7.pvn_ = pVVar4;
  NVar7 = AutoLink(this,NVar7);
  return NVar7;
}

Assistant:

pre::NodeRange DoAddVar(double lb=MinusInfty(), double ub=Infty(),
             var::Type type = var::CONTINUOUS) {
    int v = GetModel().AddVar__basic(lb, ub, type);
    return AutoLink( GetVarValueNode().Select( v ) );
  }